

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O2

void __thiscall sznet::net::Channel::handleEvent(Channel *this,Timestamp receiveTime)

{
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 auStack_38 [8];
  shared_ptr<void> guard;
  
  auStack_38 = (undefined1  [8])0x0;
  guard.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  if (this->m_tied == true) {
    std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_48,&this->m_tie);
    std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)auStack_38,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    if (auStack_38 == (undefined1  [8])0x0) goto LAB_00110078;
  }
  handleEventWithGuard(this,receiveTime);
LAB_00110078:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&guard);
  return;
}

Assistant:

void Channel::handleEvent(Timestamp receiveTime)
{
	std::shared_ptr<void> guard;
	if (m_tied)
	{
		guard = m_tie.lock();
		if (guard)
		{
			handleEventWithGuard(receiveTime);
		}
	}
	else
	{
		handleEventWithGuard(receiveTime);
	}
}